

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvactxinfo.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  char *__ptr;
  size_t sStack_40;
  
  iVar1 = nva_init();
  if (iVar1 == 0) {
    do {
      while (iVar1 = getopt(argc,argv,"c:"), iVar1 == 99) {
        __isoc99_sscanf(_optarg,"%d",&cnum);
      }
    } while (iVar1 != -1);
    if (cnum < nva_cardsnum) {
      a = 0x40981c;
      dev = *nva_cards[cnum]->bar0 >> 0x14 & 0x1ff;
      print_hwinfo();
      return 0;
    }
    if (nva_cardsnum == 0) {
      __ptr = "No cards found.\n";
      sStack_40 = 0x10;
    }
    else {
      __ptr = "No such card.\n";
      sStack_40 = 0xe;
    }
  }
  else {
    __ptr = "PCI init failure!\n";
    sStack_40 = 0x12;
  }
  fwrite(__ptr,sStack_40,1,_stderr);
  return 1;
}

Assistant:

int main(int argc, char **argv) {
	if (nva_init()) {
		fprintf (stderr, "PCI init failure!\n");
		return 1;
	}
	int c;
	while ((c = getopt (argc, argv, "c:")) != -1)
		switch (c) {
			case 'c':
				sscanf(optarg, "%d", &cnum);
				break;
		}
	if (cnum >= nva_cardsnum) {
		if (nva_cardsnum)
			fprintf (stderr, "No such card.\n");
		else
			fprintf (stderr, "No cards found.\n");
		return 1;
	}

	a = NVE0_HUB_SCRATCH_7;
	dev = nva_rd32(cnum, 0x000000);
	dev &= 0x1ff00000;
	dev >>= 20;

	print_hwinfo();

	return 0;
}